

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquation
          (BlendMaskStateMachine *this,GLenum mode)

{
  size_type sVar1;
  reference pvVar2;
  uint local_18;
  uint i;
  GLenum mode_local;
  BlendMaskStateMachine *this_local;
  
  (*this->gl->blendEquation)(mode);
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
            ::size(&this->state);
    if (sVar1 <= local_18) break;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_18);
    pvVar2->mode_rgb = mode;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_18);
    pvVar2->mode_a = mode;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquation(glw::GLenum mode)
{
	// all draw buffers
	gl.blendEquation(mode);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].mode_rgb = mode;
		state[i].mode_a   = mode;
	}
}